

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O0

bool __thiscall iutest::UnitTest::Failed(UnitTest *this)

{
  bool bVar1;
  UnitTest *this_local;
  
  bVar1 = Passed(this);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool            Failed()            const { return !Passed(); }